

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_12x12(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  JSAMPROW pJVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  DCTELEM *pDVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  DCTELEM *local_f0;
  DCTELEM local_b8 [8];
  int aiStack_98 [8];
  int local_78 [8];
  int aiStack_58 [10];
  
  uVar22 = (ulong)start_col;
  lVar16 = 0;
  local_f0 = data;
  do {
    pJVar8 = sample_data[lVar16];
    uVar23 = (ulong)((uint)pJVar8[uVar22] + (uint)pJVar8[uVar22 + 0xb]);
    uVar29 = (ulong)((uint)pJVar8[uVar22 + 2] + (uint)pJVar8[uVar22 + 9]);
    uVar28 = (ulong)((uint)pJVar8[uVar22 + 3] + (uint)pJVar8[uVar22 + 8]);
    uVar14 = (ulong)((uint)pJVar8[uVar22 + 5] + (uint)pJVar8[uVar22 + 6]);
    lVar11 = uVar14 + uVar23;
    lVar24 = uVar23 - uVar14;
    lVar15 = uVar28 + uVar29;
    lVar30 = uVar29 - uVar28;
    lVar10 = (ulong)pJVar8[uVar22] - (ulong)pJVar8[uVar22 + 0xb];
    uVar17 = (uint)pJVar8[uVar22 + 1] + (uint)pJVar8[uVar22 + 10];
    lVar21 = (ulong)pJVar8[uVar22 + 1] - (ulong)pJVar8[uVar22 + 10];
    lVar18 = (ulong)pJVar8[uVar22 + 2] - (ulong)pJVar8[uVar22 + 9];
    lVar13 = (ulong)pJVar8[uVar22 + 3] - (ulong)pJVar8[uVar22 + 8];
    uVar27 = (uint)pJVar8[uVar22 + 4] + (uint)pJVar8[uVar22 + 7];
    lVar19 = (ulong)pJVar8[uVar22 + 4] - (ulong)pJVar8[uVar22 + 7];
    lVar25 = (ulong)pJVar8[uVar22 + 5] - (ulong)pJVar8[uVar22 + 6];
    lVar20 = (ulong)uVar17 - (ulong)uVar27;
    *local_f0 = (int)lVar11 + uVar27 + uVar17 + (int)lVar15 + -0x600;
    local_f0[6] = ((int)lVar24 - (int)lVar20) - (int)lVar30;
    local_f0[4] = (DCTELEM)((lVar11 - lVar15) * 0x2731 + 0x1000U >> 0xd);
    local_f0[2] = (DCTELEM)((ulong)(lVar20 + lVar30 * 0x2bb5 + 0x1000 + lVar24 * 0x2bb6) >> 0xd);
    lVar15 = (lVar19 + lVar21) * 0x1151;
    lVar20 = lVar21 * 0x187e + lVar15;
    lVar15 = lVar19 * -0x3b21 + lVar15;
    lVar19 = (lVar18 + lVar10) * 0x23e7;
    lVar11 = (lVar13 + lVar10) * 0x1b8d;
    local_f0[1] = (DCTELEM)((ulong)(lVar25 * 0x5e8 + lVar20 +
                                   lVar19 + lVar10 * 0x1fffffffed6a + 0x1000 + lVar11) >> 0xd);
    local_f0[3] = (DCTELEM)((lVar25 + lVar18) * 0x1fffffffeeaf + (lVar10 - lVar13) * 0x29cf + lVar15
                            + 0x1000U >> 0xd);
    lVar10 = (lVar13 + lVar18) * -0x5e8;
    local_f0[5] = (DCTELEM)((ulong)(((lVar19 + lVar18 * -0x4add + 0x1000 + lVar10) - lVar15) +
                                   lVar25 * 0x1b8d) >> 0xd);
    local_f0[7] = (DCTELEM)((ulong)(lVar25 * 0x1fffffffdc19 + 0x1000 +
                                   ((lVar13 * 0x173a + lVar11 + lVar10) - lVar20)) >> 0xd);
    pDVar12 = local_b8;
    if ((int)lVar16 != 7) {
      if ((int)lVar16 == 0xb) {
        lVar16 = 0;
        for (iVar9 = 7; -1 < iVar9; iVar9 = iVar9 + -1) {
          iVar1 = *(int *)((long)data + lVar16 + 0x20);
          lVar26 = (long)(*(int *)((long)aiStack_58 + lVar16) + *(int *)((long)data + lVar16));
          iVar2 = *(int *)((long)data + lVar16 + 0x40);
          lVar31 = (long)(*(int *)((long)aiStack_98 + lVar16) + iVar2);
          iVar3 = *(int *)((long)data + lVar16 + 0x60);
          lVar15 = (long)(*(int *)((long)local_b8 + lVar16) + iVar3);
          iVar4 = *(int *)((long)data + lVar16 + 0xa0);
          iVar5 = *(int *)((long)data + lVar16 + 0xc0);
          lVar11 = (long)(iVar5 + iVar4);
          lVar10 = lVar11 + lVar26;
          lVar26 = lVar26 - lVar11;
          lVar11 = lVar15 + lVar31;
          lVar31 = lVar31 - lVar15;
          iVar6 = *(int *)((long)data + lVar16 + 0x80);
          iVar7 = *(int *)((long)data + lVar16 + 0xe0);
          lVar20 = (long)(*(int *)((long)local_78 + lVar16) + iVar1);
          lVar15 = (long)(iVar7 + iVar6);
          lVar21 = lVar20 - lVar15;
          lVar30 = (long)(*(int *)((long)data + lVar16) - *(int *)((long)aiStack_58 + lVar16));
          lVar19 = (long)(iVar1 - *(int *)((long)local_78 + lVar16));
          lVar25 = (long)(iVar2 - *(int *)((long)aiStack_98 + lVar16));
          lVar13 = (long)(iVar3 - *(int *)((long)local_b8 + lVar16));
          lVar24 = (long)(iVar6 - iVar7);
          lVar18 = (long)(iVar4 - iVar5);
          *(int *)((long)data + lVar16) =
               (int)((lVar20 + lVar15 + lVar11 + lVar10) * 0x1c72 + 0x2000U >> 0xe);
          *(int *)((long)data + lVar16 + 0xc0) =
               (int)((lVar26 - (lVar21 + lVar31)) * 0x1c72 + 0x2000U >> 0xe);
          *(int *)((long)data + lVar16 + 0x80) = (int)((lVar10 - lVar11) * 0x22d6 + 0x2000U >> 0xe);
          *(int *)((long)data + lVar16 + 0x40) =
               (int)(lVar31 * 0xa69 + lVar26 * 0x26db + lVar21 * 0x1c72 + 0x2000U >> 0xe);
          lVar11 = (lVar24 + lVar19) * 0xf65;
          lVar20 = lVar19 * 0x15c5 + lVar11;
          lVar11 = lVar24 * -0x348f + lVar11;
          lVar15 = (lVar25 + lVar30) * 0x1fea;
          lVar10 = (lVar30 + lVar13) * 0x187d;
          *(int *)((long)data + lVar16 + 0x20) =
               (int)((ulong)(lVar18 * 0x540 + lVar20 +
                            lVar30 * 0x3fffffffef7b + lVar15 + 0x2000 + lVar10) >> 0xe);
          *(int *)((long)data + lVar16 + 0x60) =
               (int)((lVar18 + lVar25) * 0x3ffffffff09b + (lVar30 - lVar13) * 0x252a + lVar11 +
                     0x2000U >> 0xe);
          lVar19 = (lVar25 + lVar13) * -0x540;
          *(int *)((long)data + lVar16 + 0xa0) =
               (int)((ulong)(((lVar15 + lVar25 * -0x428c + 0x2000 + lVar19) - lVar11) +
                            lVar18 * 0x187d) >> 0xe);
          *(int *)((long)data + lVar16 + 0xe0) =
               (int)((ulong)(lVar18 * 0x3fffffffe016 + 0x2000 +
                            ((lVar13 * 0x14a5 + lVar10 + lVar19) - lVar20)) >> 0xe);
          lVar16 = lVar16 + 4;
        }
        return;
      }
      pDVar12 = local_f0 + 8;
    }
    lVar16 = lVar16 + 1;
    local_f0 = pDVar12;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x12 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM workspace[8*4];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) (tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE);
    dataptr[6] = (DCTELEM) (tmp13 - tmp14 - tmp15);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 12)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/12)**2 = 4/9, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/24) * 8/9.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*6];

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(MULTIPLY(tmp13 - tmp14 - tmp15, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.088662108)),         /* c4 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp14 - tmp15, FIX(0.888888889)) +        /* 8/9 */
	      MULTIPLY(tmp13 + tmp15, FIX(1.214244803)),         /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX(0.481063200));   /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX(0.680326102));  /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX(1.642452502));  /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(0.997307603));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.765261039));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.516244403)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.164081699));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.164081699)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.079550144)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.765261039));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.645144899)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(0.997307603));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.161389302)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX(0.481063200)); /* c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}